

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureFilterCase::test
          (TextureFilterCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TesterType tester;
  TestLog *pTVar1;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  GLenum GVar5;
  int iVar6;
  long lVar7;
  int expected;
  int ndx;
  GLint value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  ScopedLogSection section;
  ScopedLogSection section_1;
  allocator<char> local_115;
  uint local_114;
  ResultCollector *local_110;
  code *local_108;
  GLenum local_100;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ScopedLogSection local_38;
  
  tester = (this->super_TextureTest).m_tester;
  local_110 = result;
  bVar3 = isPureIntTester(tester);
  bVar4 = true;
  if (!bVar3) {
    bVar4 = isPureUintTester(tester);
  }
  GVar5 = (this->super_TextureTest).m_pname;
  iVar6 = 0x2702;
  if (GVar5 != 0x2801) {
    iVar6 = 0;
  }
  expected = 0x2601;
  if (GVar5 != 0x2800) {
    expected = iVar6;
  }
  if (bVar4 == false) {
    pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Initial",(allocator<char> *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Initial",(allocator<char> *)&local_78);
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_58,pTVar1,&local_d8,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    StateQueryUtil::verifyStateTextureParamInteger
              (local_110,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               expected,(this->super_TextureTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_58);
  }
  pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Set",(allocator<char> *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Set",(allocator<char> *)&local_98);
  tcu::ScopedLogSection::ScopedLogSection(&local_38,pTVar1,&local_d8,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._M_dataplus._M_p._0_4_ = 0x2600;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,(uint *)&local_d8);
  local_d8._M_dataplus._M_p._0_4_ = 0x2601;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,(uint *)&local_d8);
  if ((this->super_TextureTest).m_pname == 0x2801) {
    local_d8._M_dataplus._M_p._0_4_ = 0x2700;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,(uint *)&local_d8);
    local_d8._M_dataplus._M_p._0_4_ = 0x2702;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,(uint *)&local_d8);
    local_d8._M_dataplus._M_p._0_4_ = 0x2701;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,(uint *)&local_d8);
    local_d8._M_dataplus._M_p._0_4_ = 0x2703;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,(uint *)&local_d8);
  }
  if (bVar4 == false) {
    lVar7 = 0;
    while( true ) {
      if ((int)((ulong)((long)local_f8._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_f8._M_impl.super__Vector_impl_data._M_start) >> 2) <= lVar7)
      break;
      glu::CallLogWrapper::glTexParameteri
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 local_f8._M_impl.super__Vector_impl_data._M_start[lVar7]);
      GVar5 = glu::CallLogWrapper::glGetError(gl);
      if (GVar5 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Got Error ",(allocator<char> *)&local_114);
        local_108 = glu::getErrorName;
        local_100 = GVar5;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_108);
        std::operator+(&local_58,&local_98,&local_78);
        std::operator+(&local_b8,&local_58,": ");
        std::operator+(&local_d8,&local_b8,"glTexParameteri");
        tcu::ResultCollector::fail(local_110,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_110,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 local_f8._M_impl.super__Vector_impl_data._M_start[lVar7],
                 (this->super_TextureTest).m_type);
      lVar7 = lVar7 + 1;
    }
    for (lVar7 = 0;
        lVar7 < (int)((ulong)((long)local_f8._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_f8._M_impl.super__Vector_impl_data._M_start) >> 2);
        lVar7 = lVar7 + 1) {
      glu::CallLogWrapper::glTexParameterf
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 (float)local_f8._M_impl.super__Vector_impl_data._M_start[lVar7]);
      GVar5 = glu::CallLogWrapper::glGetError(gl);
      if (GVar5 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Got Error ",(allocator<char> *)&local_114);
        local_108 = glu::getErrorName;
        local_100 = GVar5;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_108);
        std::operator+(&local_58,&local_98,&local_78);
        std::operator+(&local_b8,&local_58,": ");
        std::operator+(&local_d8,&local_b8,"glTexParameterf");
        tcu::ResultCollector::fail(local_110,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_110,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 local_f8._M_impl.super__Vector_impl_data._M_start[lVar7],
                 (this->super_TextureTest).m_type);
    }
  }
  else {
    for (lVar7 = 0; puVar2 = local_f8._M_impl.super__Vector_impl_data._M_start,
        lVar7 < (int)((ulong)((long)local_f8._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_f8._M_impl.super__Vector_impl_data._M_start) >> 2);
        lVar7 = lVar7 + 1) {
      bVar3 = isPureIntTester((this->super_TextureTest).m_tester);
      if (bVar3) {
        local_114 = puVar2[lVar7];
        glu::CallLogWrapper::glTexParameterIiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   (GLint *)&local_114);
        GVar5 = glu::CallLogWrapper::glGetError(gl);
        if (GVar5 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"Got Error ",&local_115);
          local_108 = glu::getErrorName;
          local_100 = GVar5;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_108);
          std::operator+(&local_58,&local_98,&local_78);
          std::operator+(&local_b8,&local_58,": ");
          std::operator+(&local_d8,&local_b8,"glTexParameterIiv");
          tcu::ResultCollector::fail(local_110,&local_d8);
LAB_014dda1b:
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
        }
      }
      else {
        local_114 = puVar2[lVar7];
        glu::CallLogWrapper::glTexParameterIuiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   &local_114);
        GVar5 = glu::CallLogWrapper::glGetError(gl);
        if (GVar5 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"Got Error ",&local_115);
          local_108 = glu::getErrorName;
          local_100 = GVar5;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_108);
          std::operator+(&local_58,&local_98,&local_78);
          std::operator+(&local_b8,&local_58,": ");
          std::operator+(&local_d8,&local_b8,"glTexParameterIuiv");
          tcu::ResultCollector::fail(local_110,&local_d8);
          goto LAB_014dda1b;
        }
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_110,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 local_f8._M_impl.super__Vector_impl_data._M_start[lVar7],
                 (this->super_TextureTest).m_type);
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_f8);
  tcu::ScopedLogSection::~ScopedLogSection(&local_38);
  return;
}

Assistant:

void TextureFilterCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool			isPureCase	= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const glw::GLenum	initial		= (m_pname == GL_TEXTURE_MAG_FILTER) ? (GL_LINEAR)
									: (m_pname == GL_TEXTURE_MIN_FILTER) ? (GL_NEAREST_MIPMAP_LINEAR)
									: (0);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, initial, m_type);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Set", "Set");
		std::vector<GLenum>			values;

		values.push_back(GL_NEAREST);
		values.push_back(GL_LINEAR);
		if (m_pname == GL_TEXTURE_MIN_FILTER)
		{
			values.push_back(GL_NEAREST_MIPMAP_NEAREST);
			values.push_back(GL_NEAREST_MIPMAP_LINEAR);
			values.push_back(GL_LINEAR_MIPMAP_NEAREST);
			values.push_back(GL_LINEAR_MIPMAP_LINEAR);
		}

		if (isPureCase)
		{
			for (int ndx = 0; ndx < (int)values.size(); ++ndx)
			{
				if (isPureIntTester(m_tester))
				{
					const glw::GLint value = (glw::GLint)values[ndx];
					gl.glTexParameterIiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));

					const glw::GLuint value = values[ndx];
					gl.glTexParameterIuiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
				}

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, values[ndx], m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < (int)values.size(); ++ndx)
			{
				gl.glTexParameteri(m_target, m_pname, values[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, values[ndx], m_type);
			}

			//check unit conversions with float

			for (int ndx = 0; ndx < (int)values.size(); ++ndx)
			{
				gl.glTexParameterf(m_target, m_pname, (GLfloat)values[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, values[ndx], m_type);
			}
		}
	}
}